

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O3

bool bc7decomp::unpack_bc7_mode0_2(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint32_t bits;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  undefined4 *puVar4;
  uint32_t i_2;
  uint uVar5;
  undefined1 *puVar6;
  uint32_t i;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar10;
  uint32_t bits_1;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  uint32_t total_bits;
  uint uVar14;
  uint uVar15;
  uint32_t total_bits_1;
  uint uVar16;
  uint uVar17;
  uint32_t c_1;
  long lVar18;
  long lVar19;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar20;
  uint32_t i_1;
  uint uVar21;
  bool bVar22;
  uint32_t weights [16];
  undefined1 local_118 [32];
  uint auStack_f8 [8];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_d8 [24];
  uint auStack_78 [6];
  color_rgba endpoints [6];
  uint32_t pbits [6];
  
  uVar14 = 0;
  uVar2 = 0;
  uVar16 = mode + 1;
  if (uVar16 != 0) {
    uVar17 = (uint)(mode == 0);
    uVar21 = uVar17 + 2;
    uVar7 = mode == 0 ^ 5;
    uVar1 = 0;
    uVar11 = 0;
    do {
      uVar5 = (uint)uVar11 & 7;
      iVar13 = 8 - uVar5;
      if ((int)(uVar16 - uVar1) <= iVar13) {
        iVar13 = uVar16 - uVar1;
      }
      uVar14 = uVar14 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                        (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar5)) <<
                        ((byte)uVar1 & 0x1f);
      uVar1 = uVar1 + iVar13;
      uVar11 = (ulong)(iVar13 + (uint)uVar11);
    } while (uVar1 < uVar16);
    uVar2 = 0;
    if (uVar14 == 1 << ((byte)mode & 0x1f)) {
      uVar14 = (uint)(mode != 0) * 2 + 4;
      uVar16 = 0;
      do {
        uVar1 = (uint)uVar11 & 7;
        iVar9 = uVar14 - uVar16;
        iVar13 = 8 - uVar1;
        if (iVar9 <= iVar13) {
          iVar13 = iVar9;
        }
        uVar1 = (uint)uVar2 |
                (~(-1 << ((byte)iVar13 & 0x1f)) &
                (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar1)) <<
                ((byte)uVar16 & 0x1f);
        uVar2 = (ulong)uVar1;
        uVar16 = uVar16 + iVar13;
        uVar11 = (ulong)(iVar13 + (uint)uVar11);
      } while (uVar16 < uVar14);
      lVar3 = 0;
      do {
        lVar19 = 0;
        do {
          uVar14 = 0;
          uVar16 = 0;
          do {
            uVar15 = (uint)uVar11;
            uVar5 = uVar15 & 7;
            iVar9 = uVar7 - uVar16;
            iVar13 = 8 - uVar5;
            if (iVar9 <= (int)(8 - uVar5)) {
              iVar13 = iVar9;
            }
            uVar14 = uVar14 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                              (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar5))
                              << ((byte)uVar16 & 0x1f);
            uVar16 = uVar16 + iVar13;
            uVar11 = (ulong)(iVar13 + uVar15);
          } while (uVar16 < uVar7);
          *(char *)((long)auStack_f8 + lVar19 * 4 + lVar3 + -0x20) = (char)uVar14;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 6);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      if (mode == 0) {
        iVar13 = 8 - uVar5;
        if (iVar9 < (int)(8 - uVar5)) {
          iVar13 = iVar9;
        }
        uVar11 = 0;
        do {
          uVar14 = iVar13 + uVar15 + (int)uVar11;
          auStack_f8[uVar11] =
               (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar14 >> 3)) >> (uVar14 & 7) & 1) != 0
                     );
          uVar8 = uVar11 + 1;
          bVar22 = uVar11 < 5;
          uVar11 = uVar8;
        } while (bVar22);
        iVar13 = 8 - uVar5;
        if (iVar9 < (int)(8 - uVar5)) {
          iVar13 = iVar9;
        }
        uVar11 = (ulong)(uVar15 + (int)uVar8 + iVar13);
      }
      uVar17 = uVar17 + 1;
      uVar8 = 0;
      do {
        uVar14 = uVar17;
        if (((uVar8 != 0) && (uVar8 != (byte)g_bc7_table_anchor_index_third_subset_1[uVar2])) &&
           (uVar14 = uVar21, uVar8 == (byte)g_bc7_table_anchor_index_third_subset_2[uVar2])) {
          uVar14 = uVar17;
        }
        uVar16 = 0;
        uVar7 = 0;
        do {
          uVar5 = (uint)uVar11 & 7;
          iVar13 = 8 - uVar5;
          if ((int)(uVar14 - uVar7) <= iVar13) {
            iVar13 = uVar14 - uVar7;
          }
          uVar16 = uVar16 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                            (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar5)) <<
                            ((byte)uVar7 & 0x1f);
          uVar7 = uVar7 + iVar13;
          uVar11 = (ulong)(iVar13 + (uint)uVar11);
        } while (uVar7 < uVar14);
        auStack_78[uVar8] = uVar16;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 0x10);
      puVar6 = local_118;
      lVar3 = 0;
      do {
        lVar19 = 0;
        do {
          bVar12 = puVar6[lVar19];
          if (mode == 0) {
            uVar14 = auStack_f8[lVar3] << 3 | (uint)bVar12 << 4;
            bVar12 = (byte)(uVar14 >> 5);
          }
          else {
            uVar14 = (uint)bVar12 * 8;
            bVar12 = bVar12 >> 2;
          }
          puVar6[lVar19] = bVar12 | (byte)uVar14;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        puVar6[3] = 0xff;
        lVar3 = lVar3 + 1;
        puVar6 = puVar6 + 4;
      } while (lVar3 != 6);
      paVar10 = local_d8;
      puVar6 = local_118 + 4;
      lVar3 = 0;
      do {
        lVar19 = 0;
        paVar20 = paVar10;
        do {
          puVar4 = &g_bc7_weights2;
          if (mode == 0) {
            puVar4 = &g_bc7_weights3;
          }
          iVar13 = puVar4[lVar19];
          lVar18 = 0;
          do {
            paVar20->m_comps[lVar18] =
                 (uint8_t)((uint)(byte)puVar6[lVar18 + -4] * (0x40 - iVar13) +
                           (uint)(byte)puVar6[lVar18] * iVar13 + 0x20 >> 6);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_d8[0].m_comps[lVar19 * 4 + lVar3 * 0x20 + 3] = 0xff;
          lVar19 = lVar19 + 1;
          paVar20 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar20->m_comps + 4);
        } while ((uint)lVar19 >> (sbyte)uVar21 == 0);
        lVar3 = lVar3 + 1;
        puVar6 = puVar6 + 8;
        paVar10 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar10->m_comps + 0x20);
      } while (lVar3 != 3);
      lVar3 = 0;
      do {
        pPixels[lVar3].field_0 =
             local_d8[(ulong)(byte)g_bc7_partition3[(ulong)(uVar1 << 4) + lVar3] * 8 +
                      (ulong)auStack_78[lVar3]];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      uVar2 = 1;
    }
  }
  return SUB81(uVar2,0);
}

Assistant:

bool unpack_bc7_mode0_2(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	//const uint32_t SUBSETS = 3;
	const uint32_t ENDPOINTS = 6;
	const uint32_t COMPS = 3;
	const uint32_t WEIGHT_BITS = (mode == 0) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 0) ? 4 : 5;
	const uint32_t PBITS = (mode == 0) ? 6 : 0;
	const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t part = read_bits32(pBuf, bit_offset, (mode == 0) ? 4 : 6);

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);

	uint32_t pbits[6];
	for (uint32_t p = 0; p < PBITS; p++)
		pbits[p] = read_bits32(pBuf, bit_offset, 1);

	uint32_t weights[16];
	for (uint32_t i = 0; i < 16; i++)
		weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == g_bc7_table_anchor_index_third_subset_1[part]) || (i == g_bc7_table_anchor_index_third_subset_2[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);

	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)((c == 3) ? 255 : (PBITS ? bc7_dequant(endpoints[e][c], pbits[e], ENDPOINT_BITS) : bc7_dequant(endpoints[e][c], ENDPOINT_BITS)));

	color_rgba block_colors[3][8];
	for (uint32_t s = 0; s < 3; s++)
		for (uint32_t i = 0; i < WEIGHT_VALS; i++)
		{
			for (uint32_t c = 0; c < 3; c++)
				block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
			block_colors[s][i][3] = 255;
		}

	for (uint32_t i = 0; i < 16; i++)
		pPixels[i] = block_colors[g_bc7_partition3[part * 16 + i]][weights[i]];

	return true;
}